

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_sort.cpp
# Opt level: O0

bool NextMove(Situation *situation,MoveGenerate *generate,Movement *hash_move,int step)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  UINT32 UVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Movement move;
  Movement move_00;
  Movement move_01;
  UINT8 UVar10;
  UINT8 UVar11;
  undefined1 uVar12;
  undefined2 uVar13;
  bool bVar14;
  int in_ECX;
  Movement *pMVar15;
  Movement (*paMVar16) [2];
  Movement *in_RDX;
  Movement *in_RSI;
  Situation *in_RDI;
  int flag;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Situation *in_stack_ffffffffffffffa0;
  Situation *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  bool local_1;
  
  uVar1._0_1_ = in_RSI[0x80].catc;
  uVar1._1_1_ = in_RSI[0x80].movec;
  uVar1._2_2_ = *(undefined2 *)&in_RSI[0x80].field_0xa;
  switch(uVar1) {
  case 1:
    in_RSI[0x80].catc = '\x02';
    in_RSI[0x80].movec = '\0';
    *(undefined2 *)&in_RSI[0x80].field_0xa = 0;
    if (in_RDX->from != '\0') {
      uVar8._0_1_ = in_RDX->from;
      uVar8._1_1_ = in_RDX->to;
      uVar8._2_1_ = in_RDX->capture;
      uVar8._3_1_ = in_RDX->field_0x3;
      uVar8._4_4_ = in_RDX->value;
      in_stack_ffffffffffffffcc = (undefined4)uVar8;
      in_stack_ffffffffffffffc4._0_1_ = in_RDX->catc;
      in_stack_ffffffffffffffc4._1_1_ = in_RDX->movec;
      in_stack_ffffffffffffffc4._2_2_ = *(undefined2 *)&in_RDX->field_0xa;
      move.value = in_stack_ffffffffffffffcc;
      move._0_4_ = in_stack_ffffffffffffffc8;
      move.catc = (char)uVar8._4_4_;
      move.movec = (char)((uint)uVar8._4_4_ >> 8);
      move._10_2_ = (short)((uint)uVar8._4_4_ >> 0x10);
      in_stack_ffffffffffffffd0 = uVar8._4_4_;
      in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffc4;
      bVar14 = MovementsLegal(move,in_stack_ffffffffffffffb0);
      in_stack_ffffffffffffffc0 = uVar8._4_4_;
      if (bVar14) {
        UVar10 = in_RDX->to;
        UVar11 = in_RDX->capture;
        uVar12 = in_RDX->field_0x3;
        UVar5 = in_RDX->value;
        in_RSI[0x81].from = in_RDX->from;
        in_RSI[0x81].to = UVar10;
        in_RSI[0x81].capture = UVar11;
        in_RSI[0x81].field_0x3 = uVar12;
        in_RSI[0x81].value = UVar5;
        UVar10 = in_RDX->movec;
        uVar13 = *(undefined2 *)&in_RDX->field_0xa;
        in_RSI[0x81].catc = in_RDX->catc;
        in_RSI[0x81].movec = UVar10;
        *(undefined2 *)&in_RSI[0x81].field_0xa = uVar13;
        return true;
      }
    }
    break;
  case 2:
    break;
  case 3:
    goto switchD_0010b5c8_caseD_3;
  case 4:
    goto switchD_0010b5c8_caseD_4;
  case 5:
    goto switchD_0010b5c8_caseD_5;
  case 6:
    goto switchD_0010b5c8_caseD_6;
  case 7:
    goto switchD_0010b5c8_caseD_7;
  default:
    goto switchD_0010b5c8_default;
  }
  GetAllCaptureMovements(in_RDI,(int *)in_RSI,in_RDX);
  CaptureValue(in_stack_ffffffffffffffa0,
               (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (Movement *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  std::sort<Movement*,bool(*)(Movement&,Movement&)>
            ((Movement *)in_stack_ffffffffffffffa0,
             (Movement *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (_func_bool_Movement_ptr_Movement_ptr *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  in_RSI[0x80].from = '\0';
  in_RSI[0x80].to = '\0';
  in_RSI[0x80].capture = '\0';
  in_RSI[0x80].field_0x3 = 0;
  in_RSI[0x80].catc = '\x03';
  in_RSI[0x80].movec = '\0';
  *(undefined2 *)&in_RSI[0x80].field_0xa = 0;
switchD_0010b5c8_caseD_3:
  iVar2._0_1_ = in_RSI[0x80].from;
  iVar2._1_1_ = in_RSI[0x80].to;
  iVar2._2_1_ = in_RSI[0x80].capture;
  iVar2._3_1_ = in_RSI[0x80].field_0x3;
  if ((iVar2 < (int)in_RSI[0x80].value) &&
     (iVar3._0_1_ = in_RSI[0x80].from, iVar3._1_1_ = in_RSI[0x80].to,
     iVar3._2_1_ = in_RSI[0x80].capture, iVar3._3_1_ = in_RSI[0x80].field_0x3,
     1 < in_RSI[iVar3].value)) {
    iVar4._0_1_ = in_RSI[0x80].from;
    iVar4._1_1_ = in_RSI[0x80].to;
    iVar4._2_1_ = in_RSI[0x80].capture;
    iVar4._3_1_ = in_RSI[0x80].field_0x3;
    pMVar15 = in_RSI + iVar4;
    UVar10 = pMVar15->to;
    UVar11 = pMVar15->capture;
    uVar12 = pMVar15->field_0x3;
    UVar5 = pMVar15->value;
    in_RSI[0x81].from = pMVar15->from;
    in_RSI[0x81].to = UVar10;
    in_RSI[0x81].capture = UVar11;
    in_RSI[0x81].field_0x3 = uVar12;
    in_RSI[0x81].value = UVar5;
    UVar10 = pMVar15->movec;
    uVar13 = *(undefined2 *)&pMVar15->field_0xa;
    in_RSI[0x81].catc = pMVar15->catc;
    in_RSI[0x81].movec = UVar10;
    *(undefined2 *)&in_RSI[0x81].field_0xa = uVar13;
    *(int *)(in_RSI + 0x80) = *(int *)(in_RSI + 0x80) + 1;
    local_1 = true;
  }
  else {
switchD_0010b5c8_caseD_4:
    in_RSI[0x80].catc = '\x05';
    in_RSI[0x80].movec = '\0';
    *(undefined2 *)&in_RSI[0x80].field_0xa = 0;
    if (KillerTable[in_ECX][0].from != '\0') {
      in_stack_ffffffffffffffa0 = *(Situation **)KillerTable[in_ECX];
      move_00.value = in_stack_ffffffffffffffcc;
      move_00.from = (char)in_stack_ffffffffffffffc8;
      move_00.to = (char)((uint)in_stack_ffffffffffffffc8 >> 8);
      move_00.capture = (char)((uint)in_stack_ffffffffffffffc8 >> 0x10);
      move_00._3_1_ = (char)((uint)in_stack_ffffffffffffffc8 >> 0x18);
      move_00.catc = (char)in_stack_ffffffffffffffd0;
      move_00.movec = (char)((uint)in_stack_ffffffffffffffd0 >> 8);
      move_00._10_2_ = (short)((uint)in_stack_ffffffffffffffd0 >> 0x10);
      in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffa0;
      bVar14 = MovementsLegal(move_00,in_stack_ffffffffffffffa0);
      if (bVar14) {
        paMVar16 = KillerTable + in_ECX;
        UVar10 = ((Movement *)((long)paMVar16 + 0))->to;
        UVar11 = ((Movement *)((long)paMVar16 + 0))->capture;
        uVar12 = ((Movement *)((long)paMVar16 + 0))->field_0x3;
        UVar5 = ((Movement *)((long)paMVar16 + 0))->value;
        in_RSI[0x81].from = ((Movement *)((long)paMVar16 + 0))->from;
        in_RSI[0x81].to = UVar10;
        in_RSI[0x81].capture = UVar11;
        in_RSI[0x81].field_0x3 = uVar12;
        in_RSI[0x81].value = UVar5;
        paMVar16 = KillerTable + in_ECX;
        UVar10 = ((Movement *)((long)paMVar16 + 0))->movec;
        uVar13 = *(undefined2 *)&((Movement *)((long)paMVar16 + 0))->field_0xa;
        in_RSI[0x81].catc = ((Movement *)((long)paMVar16 + 0))->catc;
        in_RSI[0x81].movec = UVar10;
        *(undefined2 *)&in_RSI[0x81].field_0xa = uVar13;
        return true;
      }
    }
switchD_0010b5c8_caseD_5:
    in_RSI[0x80].catc = '\x06';
    in_RSI[0x80].movec = '\0';
    *(undefined2 *)&in_RSI[0x80].field_0xa = 0;
    if (KillerTable[in_ECX][1].from != '\0') {
      paMVar16 = KillerTable + in_ECX;
      uVar9._0_1_ = ((Movement *)((long)paMVar16 + 0xc))->from;
      uVar9._1_1_ = ((Movement *)((long)paMVar16 + 0xc))->to;
      uVar9._2_1_ = ((Movement *)((long)paMVar16 + 0xc))->capture;
      uVar9._3_1_ = ((Movement *)((long)paMVar16 + 0xc))->field_0x3;
      uVar9._4_4_ = ((Movement *)((long)paMVar16 + 0xc))->value;
      in_stack_ffffffffffffff94 = (undefined4)uVar9;
      paMVar16 = KillerTable + in_ECX;
      in_stack_ffffffffffffff9c._0_1_ = ((Movement *)((long)paMVar16 + 0xc))->catc;
      in_stack_ffffffffffffff9c._1_1_ = ((Movement *)((long)paMVar16 + 0xc))->movec;
      in_stack_ffffffffffffff9c._2_2_ =
           *(undefined2 *)&((Movement *)((long)paMVar16 + 0xc))->field_0xa;
      move_01.value = in_stack_ffffffffffffffcc;
      move_01.from = (char)in_stack_ffffffffffffffc8;
      move_01.to = (char)((uint)in_stack_ffffffffffffffc8 >> 8);
      move_01.capture = (char)((uint)in_stack_ffffffffffffffc8 >> 0x10);
      move_01._3_1_ = (char)((uint)in_stack_ffffffffffffffc8 >> 0x18);
      move_01.catc = (char)in_stack_ffffffffffffffd0;
      move_01.movec = (char)((uint)in_stack_ffffffffffffffd0 >> 8);
      move_01._10_2_ = (short)((uint)in_stack_ffffffffffffffd0 >> 0x10);
      bVar14 = MovementsLegal(move_01,in_stack_ffffffffffffffb0);
      in_stack_ffffffffffffff98 = uVar9._4_4_;
      if (bVar14) {
        paMVar16 = KillerTable + in_ECX;
        UVar10 = ((Movement *)((long)paMVar16 + 0xc))->to;
        UVar11 = ((Movement *)((long)paMVar16 + 0xc))->capture;
        uVar12 = ((Movement *)((long)paMVar16 + 0xc))->field_0x3;
        UVar5 = ((Movement *)((long)paMVar16 + 0xc))->value;
        in_RSI[0x81].from = ((Movement *)((long)paMVar16 + 0xc))->from;
        in_RSI[0x81].to = UVar10;
        in_RSI[0x81].capture = UVar11;
        in_RSI[0x81].field_0x3 = uVar12;
        in_RSI[0x81].value = UVar5;
        paMVar16 = KillerTable + in_ECX;
        UVar10 = ((Movement *)((long)paMVar16 + 0xc))->movec;
        uVar13 = *(undefined2 *)&((Movement *)((long)paMVar16 + 0xc))->field_0xa;
        in_RSI[0x81].catc = ((Movement *)((long)paMVar16 + 0xc))->catc;
        in_RSI[0x81].movec = UVar10;
        *(undefined2 *)&in_RSI[0x81].field_0xa = uVar13;
        return true;
      }
    }
switchD_0010b5c8_caseD_6:
    UVar5 = in_RSI[0x80].value;
    GetAllNotCaptureMovements
              ((Situation *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (Movement *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    NoCaptureValue(in_RDI,(int *)&in_RSI[0x80].value,in_RSI,UVar5);
    std::sort<Movement*,bool(*)(Movement&,Movement&)>
              ((Movement *)in_stack_ffffffffffffffa0,
               (Movement *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (_func_bool_Movement_ptr_Movement_ptr *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    in_RSI[0x80].catc = '\a';
    in_RSI[0x80].movec = '\0';
    *(undefined2 *)&in_RSI[0x80].field_0xa = 0;
switchD_0010b5c8_caseD_7:
    iVar6._0_1_ = in_RSI[0x80].from;
    iVar6._1_1_ = in_RSI[0x80].to;
    iVar6._2_1_ = in_RSI[0x80].capture;
    iVar6._3_1_ = in_RSI[0x80].field_0x3;
    if (iVar6 < (int)in_RSI[0x80].value) {
      iVar7._0_1_ = in_RSI[0x80].from;
      iVar7._1_1_ = in_RSI[0x80].to;
      iVar7._2_1_ = in_RSI[0x80].capture;
      iVar7._3_1_ = in_RSI[0x80].field_0x3;
      pMVar15 = in_RSI + iVar7;
      UVar10 = pMVar15->to;
      UVar11 = pMVar15->capture;
      uVar12 = pMVar15->field_0x3;
      UVar5 = pMVar15->value;
      in_RSI[0x81].from = pMVar15->from;
      in_RSI[0x81].to = UVar10;
      in_RSI[0x81].capture = UVar11;
      in_RSI[0x81].field_0x3 = uVar12;
      in_RSI[0x81].value = UVar5;
      UVar10 = pMVar15->movec;
      uVar13 = *(undefined2 *)&pMVar15->field_0xa;
      in_RSI[0x81].catc = pMVar15->catc;
      in_RSI[0x81].movec = UVar10;
      *(undefined2 *)&in_RSI[0x81].field_0xa = uVar13;
      *(int *)(in_RSI + 0x80) = *(int *)(in_RSI + 0x80) + 1;
      local_1 = true;
    }
    else {
switchD_0010b5c8_default:
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool NextMove(const Situation& situation, MoveGenerate& generate, Movement& hash_move, int step){
    int flag;
    switch (generate.state)
    {
    case HASH_GET:
        generate.state = CAP_GEN;
        if(hash_move.from && MovementsLegal(hash_move, situation)){
            generate.next = hash_move;
            return true;
        }
    case CAP_GEN:   // 生成吃子着法
        GetAllCaptureMovements(situation, generate.move_nums, generate.moves);
        CaptureValue(situation, generate.move_nums, generate.moves);
        std::sort(generate.moves, generate.moves + generate.move_nums, cmp);

        generate.index = 0;
        generate.state = CAP_GET;
    case CAP_GET:
        if(generate.index < generate.move_nums && generate.moves[generate.index].value > 1){
            generate.next = generate.moves[generate.index];
            generate.index++;
            return true;
        }
    case KILL1_GET:
        generate.state = KILL2_GET;
        if(KillerTable[step][0].from && MovementsLegal(KillerTable[step][0], situation)){
            generate.next = KillerTable[step][0];
            return true;
        }
    case KILL2_GET:
        generate.state = NOCAP_GEN;
        if(KillerTable[step][1].from && MovementsLegal(KillerTable[step][1], situation)){
            generate.next = KillerTable[step][1];
            return true;
        }
    case NOCAP_GEN:
        flag = generate.move_nums;
        GetAllNotCaptureMovements(situation, generate.move_nums, generate.moves);
        NoCaptureValue(situation, generate.move_nums, generate.moves, flag);
        std::sort(generate.moves + flag, generate.moves + generate.move_nums, cmp);
    
        generate.state = NOCAP_GET;
    case NOCAP_GET:
        if(generate.index < generate.move_nums){
            generate.next = generate.moves[generate.index];
            generate.index++;
            return true;
        }
    default:
        return false;
    }
}